

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_0::BufferTestInstance::~BufferTestInstance(BufferTestInstance *this)

{
  ~BufferTestInstance(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

BufferTestInstance			(Context&				ctx,
															 BufferCaseParameters	testCase)
									: TestInstance		(ctx)
									, m_testCase		(testCase)
									, m_sparseContext	(createSparseContext())
								{}